

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

linked_ptr<const_testing::MatcherInterface<const_void_*>_> * __thiscall
testing::internal::linked_ptr<const_testing::MatcherInterface<const_void_*>_>::operator=
          (linked_ptr<const_testing::MatcherInterface<const_void_*>_> *this,
          linked_ptr<const_testing::MatcherInterface<const_void_*>_> *ptr)

{
  if (ptr != this) {
    depart(this);
    linked_ptr<testing::MatcherInterface<void_const*>const>::
    copy<testing::MatcherInterface<void_const*>const>
              ((linked_ptr<testing::MatcherInterface<void_const*>const> *)this,ptr);
  }
  return this;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }